

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O0

void __thiscall cppcms::widgets::password::password(password *this)

{
  undefined8 *in_RDI;
  string *in_stack_ffffffffffffffc0;
  void **in_stack_ffffffffffffffc8;
  text *in_stack_ffffffffffffffd0;
  string local_28 [24];
  base_widget *in_stack_fffffffffffffff0;
  
  base_widget::base_widget(in_stack_fffffffffffffff0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28,"password",(allocator *)&stack0xffffffffffffffd7);
  text::text(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffd7);
  *in_RDI = 0x52c780;
  in_RDI[0x13] = 0x52c840;
  in_RDI[6] = 0x52c7c8;
  booster::hold_ptr<cppcms::widgets::password::_data>::hold_ptr
            ((hold_ptr<cppcms::widgets::password::_data> *)(in_RDI + 0x11));
  in_RDI[0x12] = 0;
  return;
}

Assistant:

password::password() : text("password"), password_to_check_(0)
{
}